

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sym.cpp
# Opt level: O2

void * __thiscall StackSym::GetConstAddress(StackSym *this,bool useLocal)

{
  OpCode OVar1;
  StackSym *pSVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  undefined4 *puVar6;
  RegOpnd *pRVar7;
  AddrOpnd *pAVar8;
  Opnd *this_00;
  Instr *instr;
  
  bVar4 = IsConst(this);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.cpp"
                       ,0x292,"(this->IsConst())","this->IsConst()");
    if (!bVar4) goto LAB_005b8db2;
    *puVar6 = 0;
  }
  instr = (this->field_5).m_instrDef;
  this_00 = instr->m_src1;
  bVar4 = IR::Opnd::IsRegOpnd(this_00);
  if (bVar4) {
    pRVar7 = IR::Opnd::AsRegOpnd(this_00);
    pSVar2 = pRVar7->m_sym;
    uVar5 = *(uint *)&pSVar2->field_0x18;
    if ((uVar5 & 0x40) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.cpp"
                         ,0x29b,"(!stackSym->m_isEncodedConstant)","!stackSym->m_isEncodedConstant")
      ;
      if (!bVar4) goto LAB_005b8db2;
      *puVar6 = 0;
      uVar5 = *(uint *)&pSVar2->field_0x18;
    }
    if ((uVar5 & 1) != 0) {
      instr = (pSVar2->field_5).m_instrDef;
      this_00 = instr->m_src1;
    }
  }
  bVar4 = IR::Opnd::IsAddrOpnd(this_00);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.cpp"
                       ,0x2a4,"(src1->IsAddrOpnd())","src1->IsAddrOpnd()");
    if (!bVar4) goto LAB_005b8db2;
    *puVar6 = 0;
  }
  OVar1 = instr->m_opcode;
  if (((OVar1 != Ld_A) && (OVar1 != ArgOut_A_InlineBuiltIn)) && (OVar1 != LdStr)) {
    bVar4 = LowererMD::IsAssign(instr);
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.cpp"
                         ,0x2a5,
                         "(defInstr->m_opcode == Js::OpCode::Ld_A || defInstr->m_opcode == Js::OpCode::LdStr || defInstr->m_opcode == Js::OpCode::ArgOut_A_InlineBuiltIn || LowererMD::IsAssign(defInstr))"
                         ,
                         "defInstr->m_opcode == Js::OpCode::Ld_A || defInstr->m_opcode == Js::OpCode::LdStr || defInstr->m_opcode == Js::OpCode::ArgOut_A_InlineBuiltIn || LowererMD::IsAssign(defInstr)"
                        );
      if (!bVar4) {
LAB_005b8db2:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar6 = 0;
    }
  }
  pAVar8 = IR::Opnd::AsAddrOpnd(this_00);
  return (&pAVar8->m_localAddress)[!useLocal];
}

Assistant:

void *StackSym::GetConstAddress(bool useLocal /*= false*/) const
{
    Assert(this->IsConst());
    IR::Instr *defInstr = this->m_instrDef;
    IR::Opnd *src1 = defInstr->GetSrc1();

    StackSym * stackSym = nullptr;

    if (src1->IsRegOpnd())
    {
        stackSym = src1->AsRegOpnd()->m_sym;
        Assert(!stackSym->m_isEncodedConstant);
        if (stackSym->m_isSingleDef)
        {
            //In ARM constant load is always legalized. Try to get the constant from src def
            defInstr = stackSym->m_instrDef;
            src1 = defInstr->GetSrc1();
        }
    }

    Assert(src1->IsAddrOpnd());
    Assert(defInstr->m_opcode == Js::OpCode::Ld_A || defInstr->m_opcode == Js::OpCode::LdStr || defInstr->m_opcode == Js::OpCode::ArgOut_A_InlineBuiltIn || LowererMD::IsAssign(defInstr));
    return useLocal ? src1->AsAddrOpnd()->m_localAddress : src1->AsAddrOpnd()->m_address;
}